

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::
write_double<double>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
           *this,double value,format_specs *spec)

{
  byte bVar1;
  alignment aVar2;
  char *pcVar3;
  char *pcVar4;
  counting_iterator<char> *it;
  char cVar5;
  float_spec_handler handler;
  align_spec as;
  write_inf_or_nan_t write_inf_or_nan;
  float_spec_handler local_2aa;
  align_spec local_2a8;
  double local_298;
  double_writer local_280;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_> *local_268;
  undefined1 local_260 [16];
  undefined2 local_250;
  char local_24c;
  buffer local_248;
  char local_228 [504];
  
  local_2aa.type = (spec->super_core_format_specs).type;
  local_2aa.upper = false;
  if ((byte)local_2aa.type < 0x61) {
    switch(local_2aa.type) {
    case 'A':
    case 'E':
    case 'F':
    case 'G':
      local_2aa.upper = true;
      break;
    case 'B':
    case 'C':
    case 'D':
switchD_001f1f5f_caseD_42:
      local_298 = value;
      float_spec_handler::on_error(&local_2aa);
      value = local_298;
      break;
    default:
      if (local_2aa.type != 0) goto switchD_001f1f5f_caseD_42;
LAB_001f1f7a:
      local_2aa.type = 0x67;
    }
  }
  else if ((1 < (byte)local_2aa.type - 0x65) && (local_2aa.type != 0x61)) {
    if (local_2aa.type == 0x67) goto LAB_001f1f7a;
    goto switchD_001f1f5f_caseD_42;
  }
  if ((long)value < 0) {
    value = (double)((ulong)value ^ (ulong)DAT_0023b0d0);
    cVar5 = '-';
  }
  else {
    bVar1 = (spec->super_core_format_specs).flags;
    if ((bVar1 & 1) == 0) {
      cVar5 = '\0';
    }
    else {
      cVar5 = '+';
      if ((bVar1 & 2) == 0) {
        cVar5 = ' ';
      }
    }
  }
  local_260._0_4_ = (spec->super_align_spec).width_;
  local_260._4_4_ = (spec->super_align_spec).fill_;
  local_260._8_8_ = *(undefined8 *)&(spec->super_align_spec).align_;
  local_250._0_1_ = (spec->super_core_format_specs).flags;
  local_250._1_1_ = (spec->super_core_format_specs).type;
  local_268 = this;
  local_24c = cVar5;
  if (NAN(value)) {
    pcVar4 = "NAN";
    pcVar3 = "    nan";
LAB_001f200c:
    local_248.ptr_ = pcVar3 + 4;
    if (local_2aa.upper != false) {
      local_248.ptr_ = pcVar4;
    }
    local_248._vptr_basic_buffer = (_func_int **)CONCAT71(local_248._vptr_basic_buffer._1_7_,cVar5);
    basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
    write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::inf_or_nan_writer>
              ((basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
                *)this,(align_spec *)local_260,(inf_or_nan_writer *)&local_248);
    return;
  }
  if (INFINITY <= value) {
    pcVar4 = "INF";
    pcVar3 = "    inf";
    goto LAB_001f200c;
  }
  local_248.size_ = 0;
  local_248._vptr_basic_buffer = (_func_int **)&PTR_grow_002a8bf0;
  local_248.capacity_ = 500;
  local_248.ptr_ = local_228;
  internal::sprintf_format<double>
            (value,&local_248,
             (core_format_specs)
             ((ulong)spec->super_core_format_specs & 0xffff00ffffffffff |
             (ulong)(byte)local_2aa.type << 0x28));
  local_2a8.align_ = (spec->super_align_spec).align_;
  local_2a8.width_ = (spec->super_align_spec).width_;
  local_2a8.fill_ = (spec->super_align_spec).fill_;
  aVar2 = (spec->super_align_spec).align_;
  if (aVar2 == ALIGN_DEFAULT) {
    local_2a8.align_ = ALIGN_RIGHT;
  }
  else if (aVar2 == ALIGN_NUMERIC) {
    if (cVar5 != '\0') {
      (this->out_).count_ = (this->out_).count_ + 1;
      if (local_2a8.width_ != 0) {
        local_2a8.width_ = local_2a8.width_ - 1;
      }
    }
    local_2a8.align_ = ALIGN_RIGHT;
    local_280.n = local_248.size_;
    local_280.sign = '\0';
    goto LAB_001f20d7;
  }
  local_280.n = (local_248.size_ + 1) - (ulong)(cVar5 == '\0');
  local_280.sign = cVar5;
LAB_001f20d7:
  local_280.buffer = &local_248;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
  write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::double_writer>
            ((basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>> *
             )this,&local_2a8,&local_280);
  local_248._vptr_basic_buffer = (_func_int **)&PTR_grow_002a8bf0;
  if (local_248.ptr_ == local_228) {
    return;
  }
  operator_delete(local_248.ptr_);
  return;
}

Assistant:

void basic_writer<Range>::write_double(T value, const format_specs &spec) {
  // Check type.
  float_spec_handler handler(static_cast<char>(spec.type));
  internal::handle_float_type_spec(handler.type, handler);

  char sign = 0;
  // Use signbit instead of value < 0 because the latter is always
  // false for NaN.
  if (std::signbit(value)) {
    sign = '-';
    value = -value;
  } else if (spec.has(SIGN_FLAG)) {
    sign = spec.has(PLUS_FLAG) ? '+' : ' ';
  }

  struct write_inf_or_nan_t {
    basic_writer &writer;
    format_specs spec;
    char sign;
    void operator()(const char *str) const {
      writer.write_padded(spec, inf_or_nan_writer{sign, str});
    }
  } write_inf_or_nan = {*this, spec, sign};

  // Format NaN and ininity ourselves because sprintf's output is not consistent
  // across platforms.
  if (internal::fputil::isnotanumber(value))
    return write_inf_or_nan(handler.upper ? "NAN" : "nan");
  if (internal::fputil::isinfinity(value))
    return write_inf_or_nan(handler.upper ? "INF" : "inf");

  memory_buffer buffer;
  bool use_grisu = FMT_USE_GRISU && sizeof(T) <= sizeof(double) &&
      spec.type != 'a' && spec.type != 'A' &&
      internal::grisu2_format(static_cast<double>(value), buffer, spec);
  if (!use_grisu) {
    format_specs normalized_spec(spec);
    normalized_spec.type = handler.type;
    internal::sprintf_format(value, buffer, normalized_spec);
  }
  size_t n = buffer.size();
  align_spec as = spec;
  if (spec.align() == ALIGN_NUMERIC) {
    if (sign) {
      auto &&it = reserve(1);
      *it++ = static_cast<char_type>(sign);
      sign = 0;
      if (as.width_)
        --as.width_;
    }
    as.align_ = ALIGN_RIGHT;
  } else {
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    if (sign)
      ++n;
  }
  write_padded(as, double_writer{n, sign, buffer});
}